

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

void __thiscall OpenMD::OpenMDBitSet::flip(OpenMDBitSet *this,size_t fromIndex,size_t toIndex)

{
  iterator *in_RDI;
  iterator iVar1;
  iterator iVar2;
  iterator last;
  iterator first;
  
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1a8290);
  iVar1 = std::operator+(in_RDI,0x1a82d2);
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1a8308);
  iVar2 = std::operator+(in_RDI,0x1a8335);
  std::transform<std::_Bit_iterator,std::_Bit_iterator,std::logical_not<bool>>
            (iVar1.super__Bit_iterator_base._M_p,iVar1.super__Bit_iterator_base._M_offset,
             iVar2.super__Bit_iterator_base._M_p,iVar2.super__Bit_iterator_base._M_offset,
             iVar1.super__Bit_iterator_base._M_p,iVar1.super__Bit_iterator_base._M_offset);
  return;
}

Assistant:

void OpenMDBitSet::flip(size_t fromIndex, size_t toIndex) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;

    std::transform(first, last, first, std::logical_not<bool>());
  }